

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::output_three_particle_correlation(singleParticleSpectra *this)

{
  ostream *poVar1;
  char *pcVar2;
  int i;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  char *local_ab0 [4];
  ofstream output_os;
  undefined8 auStack_a88 [2];
  uint auStack_a78 [122];
  ofstream output_ss;
  undefined8 auStack_888 [2];
  uint auStack_878 [122];
  ofstream output;
  undefined8 auStack_688 [2];
  uint auStack_678 [122];
  ostringstream filename_os;
  ostringstream filename_ss;
  ostringstream filename;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename);
  if (this->rap_type == 0) {
    poVar1 = std::operator<<((ostream *)&filename,(string *)this);
    poVar1 = std::operator<<(poVar1,"/particle_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    poVar1 = std::operator<<(poVar1,"_Cmnk");
    pcVar2 = "_Cmnk_os_eta_";
  }
  else {
    poVar1 = std::operator<<((ostream *)&filename,(string *)this);
    poVar1 = std::operator<<(poVar1,"/particle_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    poVar1 = std::operator<<(poVar1,"_Cmnk");
    pcVar2 = "_Cmnk_os_y_";
  }
  std::operator<<(poVar1,pcVar2 + 8);
  poVar1 = std::ostream::_M_insert<double>(this->rap_min);
  std::operator<<(poVar1,"_");
  poVar1 = std::ostream::_M_insert<double>(this->rap_max);
  std::operator<<(poVar1,".dat");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output,_output_ss,_S_out);
  std::__cxx11::string::~string((string *)&output_ss);
  poVar1 = std::operator<<((ostream *)&output,"# n  C_nmk  C_nmk_err");
  std::endl<char,std::char_traits<char>>(poVar1);
  dVar6 = (double)this->total_number_of_events;
  dVar7 = *(this->C_nmk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar6;
  dVar4 = *(this->C_nmk_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar6 - dVar7 * dVar7;
  local_ae0 = 0.0;
  if (0.0 < dVar4) {
    dVar4 = dVar4 / dVar6;
    if (dVar4 < 0.0) {
      local_ae0 = sqrt(dVar4);
    }
    else {
      local_ae0 = SQRT(dVar4);
    }
  }
  *(uint *)((long)auStack_678 + *(long *)(_output + -0x18)) =
       *(uint *)((long)auStack_678 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)((long)auStack_688 + *(long *)(_output + -0x18) + 8) = 0x12;
  *(undefined8 *)((long)auStack_688 + *(long *)(_output + -0x18)) = 8;
  poVar1 = (ostream *)std::ostream::operator<<(&output,0);
  std::operator<<(poVar1,"  ");
  poVar1 = std::ostream::_M_insert<double>(dVar7);
  std::operator<<(poVar1,"  ");
  poVar1 = std::ostream::_M_insert<double>(local_ae0);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar3 = 1; lVar3 < this->num_corr; lVar3 = lVar3 + 1) {
    dVar6 = (double)this->total_number_of_events;
    dVar8 = (this->C_nmk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3] / dVar6;
    dVar4 = (this->C_nmk_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3] / dVar6 - dVar8 * dVar8;
    local_ae0 = 0.0;
    if (0.0 < dVar4) {
      dVar4 = dVar4 / dVar6;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      local_ae0 = dVar4 / dVar7;
    }
    *(uint *)((long)auStack_678 + *(long *)(_output + -0x18)) =
         *(uint *)((long)auStack_678 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_688 + *(long *)(_output + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_688 + *(long *)(_output + -0x18)) = 8;
    poVar1 = (ostream *)std::ostream::operator<<(&output,(int)lVar3);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(dVar8 / dVar7);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(local_ae0);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if (this->flag_charge_dependence == 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename_ss);
    if (this->rap_type == 0) {
      poVar1 = std::operator<<((ostream *)&filename_ss,(string *)this);
      poVar1 = std::operator<<(poVar1,"/particle_");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
      pcVar2 = "_Cmnk_ss_eta_";
    }
    else {
      poVar1 = std::operator<<((ostream *)&filename_ss,(string *)this);
      poVar1 = std::operator<<(poVar1,"/particle_");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
      pcVar2 = "_Cmnk_ss_y_";
    }
    std::operator<<(poVar1,pcVar2);
    poVar1 = std::ostream::_M_insert<double>(this->rap_min);
    std::operator<<(poVar1,"_");
    poVar1 = std::ostream::_M_insert<double>(this->rap_max);
    std::operator<<(poVar1,".dat");
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output_ss,_output_os,_S_out);
    std::__cxx11::string::~string((string *)&output_os);
    poVar1 = std::operator<<((ostream *)&output_ss,
                             "# n  C_nmk_ss  C_nmk_ss_err  C_nmk_ss_13  C_nmk_ss_13_err");
    std::endl<char,std::char_traits<char>>(poVar1);
    dVar4 = (double)this->total_number_of_events;
    dVar6 = *(this->C_nmk_ss).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar4;
    local_ad8 = *(this->C_nmk_ss_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start / dVar4 - dVar6 * dVar6;
    local_ae0 = 0.0;
    if (local_ad8 <= 0.0) {
      local_ad8 = 0.0;
    }
    else {
      local_ad8 = local_ad8 / dVar4;
      if (local_ad8 < 0.0) {
        local_ad8 = sqrt(local_ad8);
      }
      else {
        local_ad8 = SQRT(local_ad8);
      }
      dVar4 = (double)this->total_number_of_events;
    }
    dVar8 = *(this->C_nmk_ss_13).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar4;
    dVar7 = *(this->C_nmk_ss_13_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar4 - dVar8 * dVar8;
    if (0.0 < dVar7) {
      dVar7 = dVar7 / dVar4;
      if (dVar7 < 0.0) {
        local_ae0 = sqrt(dVar7);
      }
      else {
        local_ae0 = SQRT(dVar7);
      }
    }
    *(uint *)((long)auStack_878 + *(long *)(_output_ss + -0x18)) =
         *(uint *)((long)auStack_878 + *(long *)(_output_ss + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_888 + *(long *)(_output_ss + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_888 + *(long *)(_output_ss + -0x18)) = 8;
    poVar1 = (ostream *)std::ostream::operator<<(&output_ss,0);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(local_ad8);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(local_ae0);
    std::endl<char,std::char_traits<char>>(poVar1);
    for (lVar3 = 1; lVar3 < this->num_corr; lVar3 = lVar3 + 1) {
      dVar4 = (double)this->total_number_of_events;
      dVar7 = (this->C_nmk_ss).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] / dVar4;
      local_ad0 = (this->C_nmk_ss_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3] / dVar4 - dVar7 * dVar7;
      local_ae0 = 0.0;
      if (local_ad0 <= 0.0) {
        local_ad0 = 0.0;
      }
      else {
        local_ad0 = local_ad0 / dVar4;
        if (local_ad0 < 0.0) {
          local_ad0 = sqrt(local_ad0);
        }
        else {
          local_ad0 = SQRT(local_ad0);
        }
        local_ad0 = local_ad0 / dVar6;
        dVar4 = (double)this->total_number_of_events;
      }
      dVar9 = (this->C_nmk_ss_13).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] / dVar4;
      dVar5 = (this->C_nmk_ss_13_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] / dVar4 - dVar9 * dVar9;
      if (0.0 < dVar5) {
        dVar5 = dVar5 / dVar4;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        local_ae0 = dVar5 / dVar8;
      }
      *(uint *)((long)auStack_878 + *(long *)(_output_ss + -0x18)) =
           *(uint *)((long)auStack_878 + *(long *)(_output_ss + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_888 + *(long *)(_output_ss + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_888 + *(long *)(_output_ss + -0x18)) = 8;
      poVar1 = (ostream *)std::ostream::operator<<(&output_ss,(int)lVar3);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar7 / dVar6);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_ad0);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar9 / dVar8);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_ae0);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename_os);
    if (this->rap_type == 0) {
      poVar1 = std::operator<<((ostream *)&filename_os,(string *)this);
      poVar1 = std::operator<<(poVar1,"/particle_");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
      pcVar2 = "_Cmnk_os_eta_";
    }
    else {
      poVar1 = std::operator<<((ostream *)&filename_os,(string *)this);
      poVar1 = std::operator<<(poVar1,"/particle_");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
      pcVar2 = "_Cmnk_os_y_";
    }
    std::operator<<(poVar1,pcVar2);
    poVar1 = std::ostream::_M_insert<double>(this->rap_min);
    std::operator<<(poVar1,"_");
    poVar1 = std::ostream::_M_insert<double>(this->rap_max);
    std::operator<<(poVar1,".dat");
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output_os,local_ab0[0],_S_out);
    std::__cxx11::string::~string((string *)local_ab0);
    poVar1 = std::operator<<((ostream *)&output_os,
                             "# n  C_nmk_os  C_nmk_os_err  C_nmk_os_13  C_nmk_os_13_err");
    std::endl<char,std::char_traits<char>>(poVar1);
    dVar4 = (double)this->total_number_of_events;
    dVar6 = *(this->C_nmk_os).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar4;
    local_ad8 = *(this->C_nmk_os_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start / dVar4 - dVar6 * dVar6;
    local_ae0 = 0.0;
    if (local_ad8 <= 0.0) {
      local_ad8 = 0.0;
    }
    else {
      local_ad8 = local_ad8 / dVar4;
      if (local_ad8 < 0.0) {
        local_ad8 = sqrt(local_ad8);
      }
      else {
        local_ad8 = SQRT(local_ad8);
      }
      dVar4 = (double)this->total_number_of_events;
    }
    dVar8 = *(this->C_nmk_os_13).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar4;
    dVar7 = *(this->C_nmk_os_13_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar4 - dVar8 * dVar8;
    if (0.0 < dVar7) {
      dVar7 = dVar7 / dVar4;
      if (dVar7 < 0.0) {
        local_ae0 = sqrt(dVar7);
      }
      else {
        local_ae0 = SQRT(dVar7);
      }
    }
    *(uint *)((long)auStack_a78 + *(long *)(_output_os + -0x18)) =
         *(uint *)((long)auStack_a78 + *(long *)(_output_os + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_a88 + *(long *)(_output_os + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_a88 + *(long *)(_output_os + -0x18)) = 8;
    poVar1 = (ostream *)std::ostream::operator<<(&output_os,0);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(local_ad8);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(local_ae0);
    std::endl<char,std::char_traits<char>>(poVar1);
    for (lVar3 = 1; lVar3 < this->num_corr; lVar3 = lVar3 + 1) {
      dVar4 = (double)this->total_number_of_events;
      dVar7 = (this->C_nmk_os).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] / dVar4;
      local_ad0 = (this->C_nmk_os_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3] / dVar4 - dVar7 * dVar7;
      local_ae0 = 0.0;
      if (local_ad0 <= 0.0) {
        local_ad0 = 0.0;
      }
      else {
        local_ad0 = local_ad0 / dVar4;
        if (local_ad0 < 0.0) {
          local_ad0 = sqrt(local_ad0);
        }
        else {
          local_ad0 = SQRT(local_ad0);
        }
        local_ad0 = local_ad0 / dVar6;
        dVar4 = (double)this->total_number_of_events;
      }
      dVar9 = (this->C_nmk_os_13).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] / dVar4;
      dVar5 = (this->C_nmk_os_13_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] / dVar4 - dVar9 * dVar9;
      if (0.0 < dVar5) {
        dVar5 = dVar5 / dVar4;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        local_ae0 = dVar5 / dVar8;
      }
      *(uint *)((long)auStack_a78 + *(long *)(_output_os + -0x18)) =
           *(uint *)((long)auStack_a78 + *(long *)(_output_os + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_a88 + *(long *)(_output_os + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_a88 + *(long *)(_output_os + -0x18)) = 8;
      poVar1 = (ostream *)std::ostream::operator<<(&output_os,(int)lVar3);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar7 / dVar6);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_ad0);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar9 / dVar8);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_ae0);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::ofstream::~ofstream(&output_os);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename_os);
    std::ofstream::~ofstream(&output_ss);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename_ss);
  }
  std::ofstream::~ofstream(&output);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename);
  return;
}

Assistant:

void singleParticleSpectra::output_three_particle_correlation() {
    ostringstream filename;
    if (rap_type == 0) {
        filename << path_ << "/particle_" << particle_monval << "_Cmnk"
                 << "_eta_" << rap_min << "_" << rap_max << ".dat";
    } else {
        filename << path_ << "/particle_" << particle_monval << "_Cmnk"
                 << "_y_" << rap_min << "_" << rap_max << ".dat";
    }
    ofstream output(filename.str().c_str());
    output << "# n  C_nmk  C_nmk_err" << endl;

    double num_pair = C_nmk[0] / total_number_of_events;
    double num_pair_stdsq =
        (C_nmk_err[0] / total_number_of_events - num_pair * num_pair);
    double num_pair_err = 0.0;
    if (num_pair_stdsq > 0) {
        num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
    }
    output << scientific << setw(18) << setprecision(8) << 0 << "  " << num_pair
           << "  " << num_pair_err << endl;
    for (int i = 1; i < num_corr; i++) {
        double Cnmk_avg = C_nmk[i] / total_number_of_events;
        double Cnmk_stdsq =
            (C_nmk_err[i] / total_number_of_events - Cnmk_avg * Cnmk_avg);
        Cnmk_avg = Cnmk_avg / num_pair;
        double Cnmk_err = 0.0;
        if (Cnmk_stdsq > 0) {
            Cnmk_err = sqrt(Cnmk_stdsq / total_number_of_events);
            Cnmk_err = Cnmk_err / num_pair;
        }
        output << scientific << setw(18) << setprecision(8) << i << "  "
               << Cnmk_avg << "  " << Cnmk_err << endl;
    }
    if (flag_charge_dependence == 1) {
        ostringstream filename_ss;
        if (rap_type == 0) {
            filename_ss << path_ << "/particle_" << particle_monval
                        << "_Cmnk_ss_eta_" << rap_min << "_" << rap_max
                        << ".dat";
        } else {
            filename_ss << path_ << "/particle_" << particle_monval
                        << "_Cmnk_ss_y_" << rap_min << "_" << rap_max << ".dat";
        }
        ofstream output_ss(filename_ss.str().c_str());
        output_ss << "# n  C_nmk_ss  C_nmk_ss_err  C_nmk_ss_13  C_nmk_ss_13_err"
                  << endl;

        double num_pair_ss = C_nmk_ss[0] / total_number_of_events;
        double num_pair_ss_stdsq =
            (C_nmk_ss_err[0] / total_number_of_events
             - num_pair_ss * num_pair_ss);
        double num_pair_ss_err = 0.0;
        if (num_pair_ss_stdsq > 0) {
            num_pair_ss_err = sqrt(num_pair_ss_stdsq / total_number_of_events);
        }
        double num_pair_ss_13 = C_nmk_ss_13[0] / total_number_of_events;
        double num_pair_ss_13_stdsq =
            (C_nmk_ss_13_err[0] / total_number_of_events
             - num_pair_ss_13 * num_pair_ss_13);
        double num_pair_ss_13_err = 0.0;
        if (num_pair_ss_13_stdsq > 0) {
            num_pair_ss_13_err =
                sqrt(num_pair_ss_13_stdsq / total_number_of_events);
        }
        output_ss << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_ss << "  " << num_pair_ss_err << "  "
                  << num_pair_ss_13 << "  " << num_pair_ss_13_err << endl;
        for (int i = 1; i < num_corr; i++) {
            double Cnmk_ss_avg = C_nmk_ss[i] / total_number_of_events;
            double Cnmk_ss_stdsq =
                (C_nmk_ss_err[i] / total_number_of_events
                 - Cnmk_ss_avg * Cnmk_ss_avg);
            Cnmk_ss_avg = Cnmk_ss_avg / num_pair_ss;
            double Cnmk_ss_err = 0.0;
            if (Cnmk_ss_stdsq > 0) {
                Cnmk_ss_err = sqrt(Cnmk_ss_stdsq / total_number_of_events);
                Cnmk_ss_err = Cnmk_ss_err / num_pair_ss;
            }
            double Cnmk_ss_13_avg = C_nmk_ss_13[i] / total_number_of_events;
            double Cnmk_ss_13_stdsq =
                (C_nmk_ss_13_err[i] / total_number_of_events
                 - Cnmk_ss_13_avg * Cnmk_ss_13_avg);
            Cnmk_ss_13_avg = Cnmk_ss_13_avg / num_pair_ss_13;
            double Cnmk_ss_13_err = 0.0;
            if (Cnmk_ss_13_stdsq > 0) {
                Cnmk_ss_13_err =
                    sqrt(Cnmk_ss_13_stdsq / total_number_of_events);
                Cnmk_ss_13_err = Cnmk_ss_13_err / num_pair_ss_13;
            }
            output_ss << scientific << setw(18) << setprecision(8) << i << "  "
                      << Cnmk_ss_avg << "  " << Cnmk_ss_err << "  "
                      << Cnmk_ss_13_avg << "  " << Cnmk_ss_13_err << endl;
        }
        ostringstream filename_os;
        if (rap_type == 0) {
            filename_os << path_ << "/particle_" << particle_monval
                        << "_Cmnk_os_eta_" << rap_min << "_" << rap_max
                        << ".dat";
        } else {
            filename_os << path_ << "/particle_" << particle_monval
                        << "_Cmnk_os_y_" << rap_min << "_" << rap_max << ".dat";
        }
        ofstream output_os(filename_os.str().c_str());
        output_os << "# n  C_nmk_os  C_nmk_os_err  C_nmk_os_13  C_nmk_os_13_err"
                  << endl;

        double num_pair_os = C_nmk_os[0] / total_number_of_events;
        double num_pair_os_stdsq =
            (C_nmk_os_err[0] / total_number_of_events
             - num_pair_os * num_pair_os);
        double num_pair_os_err = 0.0;
        if (num_pair_os_stdsq > 0) {
            num_pair_os_err = sqrt(num_pair_os_stdsq / total_number_of_events);
        }
        double num_pair_os_13 = C_nmk_os_13[0] / total_number_of_events;
        double num_pair_os_13_stdsq =
            (C_nmk_os_13_err[0] / total_number_of_events
             - num_pair_os_13 * num_pair_os_13);
        double num_pair_os_13_err = 0.0;
        if (num_pair_os_13_stdsq > 0) {
            num_pair_os_13_err =
                sqrt(num_pair_os_13_stdsq / total_number_of_events);
        }
        output_os << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_os << "  " << num_pair_os_err << "  "
                  << num_pair_os_13 << "  " << num_pair_os_13_err << endl;
        for (int i = 1; i < num_corr; i++) {
            double Cnmk_os_avg = C_nmk_os[i] / total_number_of_events;
            double Cnmk_os_stdsq =
                (C_nmk_os_err[i] / total_number_of_events
                 - Cnmk_os_avg * Cnmk_os_avg);
            Cnmk_os_avg = Cnmk_os_avg / num_pair_os;
            double Cnmk_os_err = 0.0;
            if (Cnmk_os_stdsq > 0) {
                Cnmk_os_err = sqrt(Cnmk_os_stdsq / total_number_of_events);
                Cnmk_os_err = Cnmk_os_err / num_pair_os;
            }
            double Cnmk_os_13_avg = C_nmk_os_13[i] / total_number_of_events;
            double Cnmk_os_13_stdsq =
                (C_nmk_os_13_err[i] / total_number_of_events
                 - Cnmk_os_13_avg * Cnmk_os_13_avg);
            Cnmk_os_13_avg = Cnmk_os_13_avg / num_pair_os_13;
            double Cnmk_os_13_err = 0.0;
            if (Cnmk_os_13_stdsq > 0) {
                Cnmk_os_13_err =
                    sqrt(Cnmk_os_13_stdsq / total_number_of_events);
                Cnmk_os_13_err = Cnmk_os_13_err / num_pair_os_13;
            }
            output_os << scientific << setw(18) << setprecision(8) << i << "  "
                      << Cnmk_os_avg << "  " << Cnmk_os_err << "  "
                      << Cnmk_os_13_avg << "  " << Cnmk_os_13_err << endl;
        }
    }
}